

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabBar *tab_bar;
  bool bVar1;
  ImGuiTabItem *pIVar2;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    tab_bar = GImGui->CurrentTabBar;
    if (tab_bar == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar) && \"Needs to be called between BeginTabBar() and EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                    ,0x1ec4,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("(flags & ImGuiTabItemFlags_Button) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                    ,0x1ec7,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    bVar1 = TabItemEx(tab_bar,label,p_open,flags,(ImGuiWindow *)0x0);
    if ((char)((flags & 8U) >> 3) == '\0' && bVar1) {
      pIVar2 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,(int)tab_bar->LastTabItemIdx);
      PushOverrideID(pIVar2->ID);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return false;
    }
    IM_ASSERT((flags & ImGuiTabItemFlags_Button) == 0);             // BeginTabItem() Can't be used with button flags, use TabItemButton() instead!

    bool ret = TabItemEx(tab_bar, label, p_open, flags, NULL);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        PushOverrideID(tab->ID); // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}